

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void __thiscall
glslang::TReflectionTraverser::addDereferencedUniform
          (TReflectionTraverser *this,TIntermBinary *topNode)

{
  _Rb_tree_header *p_Var1;
  _List_node_header *deref;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar2;
  _func_int **pp_Var3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  long *plVar10;
  TIntermSymbol *pTVar11;
  undefined4 extraout_var_00;
  _Base_ptr p_Var12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TType *pTVar14;
  _List_node_base *p_Var15;
  TIntermBinary *pTVar16;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long lVar17;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  _Base_ptr p_Var18;
  bool bVar19;
  int local_98;
  TString baseName;
  TList<glslang::TIntermBinary_*> derefs;
  
  iVar6 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(topNode);
  plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0xf0))
                              ((long *)CONCAT44(extraout_var,iVar6));
  cVar4 = (**(code **)(*plVar10 + 0xd8))(plVar10);
  if (((cVar4 != '\0') || (cVar4 = (**(code **)(*plVar10 + 0xe0))(plVar10), cVar4 != '\0')) &&
     (cVar4 = (**(code **)(*plVar10 + 0xe8))(plVar10), cVar4 == '\0')) {
    return;
  }
  pTVar11 = findBase(this,topNode);
  if ((pTVar11 != (TIntermSymbol *)0x0) &&
     (iVar6 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar11),
     (*(uint *)(CONCAT44(extraout_var_00,iVar6) + 8) & 0x7f) - 5 < 2)) {
    p_Var12 = (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var12 != (_Base_ptr)0x0) {
      p_Var1 = &(this->processedDerefs)._M_t._M_impl.super__Rb_tree_header;
      p_Var18 = &p_Var1->_M_header;
      do {
        if (*(TIntermBinary **)(p_Var12 + 1) >= topNode) {
          p_Var18 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[*(TIntermBinary **)(p_Var12 + 1) < topNode];
      } while (p_Var12 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var18 != p_Var1) && (*(TIntermBinary **)(p_Var18 + 1) <= topNode)) {
        return;
      }
    }
    iVar6 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(pTVar11);
    if (iVar6 == 0x10) {
      iVar7 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar11);
      iVar7 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_01,iVar7),0,5,"anon@");
      iVar8 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
      pbVar13 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0x28))
                          ((long *)CONCAT44(extraout_var_02,iVar8));
      baseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
      baseName._M_string_length = 0;
      baseName.field_2._M_local_buf[0] = '\0';
      bVar19 = iVar7 == 0;
      if (!bVar19) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_assign(&baseName,pbVar13);
      }
      iVar7 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
      iVar8 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
      iVar8 = TIntermediate::getBlockSize((TType *)CONCAT44(extraout_var_04,iVar8));
      iVar7 = addBlockName(this,pbVar13,(TType *)CONCAT44(extraout_var_03,iVar7),iVar8);
      if ((this->reflection->options & EShReflectionAllBlockVariables) != EShReflectionDefault) {
        derefs.
        super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
        super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
        ._M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
        deref = &derefs.
                 super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                 .
                 super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                 ._M_impl._M_node;
        derefs.
        super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
        super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
        ._M_impl._M_node._M_size = 0;
        derefs.
        super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
        super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
        ._M_impl._M_node.super__List_node_base._M_next = &deref->super__List_node_base;
        derefs.
        super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
        super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
        ._M_impl._M_node.super__List_node_base._M_prev = &deref->super__List_node_base;
        iVar8 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
        iVar9 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar11);
        blowUpActiveAggregate
                  (this,(TType *)CONCAT44(extraout_var_05,iVar8),&baseName,&derefs,
                   (const_iterator)deref,0,iVar7,0,-1,0,
                   *(TStorageQualifier *)(CONCAT44(extraout_var_06,iVar9) + 8) & 0x7f,false);
      }
      local_98 = 0;
    }
    else {
      iVar7 = -1;
      bVar19 = false;
      local_98 = -1;
    }
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node.super__List_node_base._M_next =
         &derefs.
          super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
          super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
          ._M_impl._M_node.super__List_node_base;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node._M_size = 0;
    pTVar16 = topNode;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev =
         derefs.
         super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
         super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    do {
      plVar10 = (long *)(*(code *)((_List_node_base *)
                                  (pTVar16->super_TIntermOperator).super_TIntermTyped.
                                  super_TIntermNode._vptr_TIntermNode)[0x19]._M_next)(pTVar16);
      pTVar14 = (TType *)(**(code **)(*plVar10 + 0xf0))(plVar10);
      bVar5 = isReflectionGranularity(this,pTVar14);
      if (!bVar5) {
        p_Var15 = (_List_node_base *)
                  TPoolAllocator::allocate
                            (derefs.
                             super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                             .
                             super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                             ._M_impl.super__Node_alloc_type.allocator,0x18);
        p_Var15[1]._M_next = (_List_node_base *)pTVar16;
        std::__detail::_List_node_base::_M_hook(p_Var15);
        derefs.
        super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
        super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
        ._M_impl._M_node._M_size =
             derefs.
             super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
             .
             super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
             ._M_impl._M_node._M_size + 1;
        baseName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)pTVar16;
        std::
        _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
        ::_M_insert_unique<TIntermNode_const*>
                  ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
                    *)&this->processedDerefs,(TIntermNode **)&baseName);
      }
      plVar10 = (long *)(*(code *)((_List_node_base *)
                                  (pTVar16->super_TIntermOperator).super_TIntermTyped.
                                  super_TIntermNode._vptr_TIntermNode)[0x19]._M_next)(pTVar16);
      pTVar16 = (TIntermBinary *)(**(code **)(*plVar10 + 0x40))(plVar10);
    } while (pTVar16 != (TIntermBinary *)0x0);
    baseName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)pTVar11;
    std::
    _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
    ::_M_insert_unique<TIntermNode_const*>
              ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
                *)&this->processedDerefs,(TIntermNode **)&baseName);
    iVar8 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(topNode);
    pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar8) + 0xf0))
                                 ((long *)CONCAT44(extraout_var_07,iVar8));
    bVar5 = isReflectionGranularity(this,pTVar14);
    iVar8 = 0;
    if (bVar5) {
      iVar9 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(topNode);
      cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar9) + 0x150))
                        ((long *)CONCAT44(extraout_var_08,iVar9));
      if ((cVar4 != '\0') && ((topNode->super_TIntermOperator).op == EOpIndexDirect)) {
        iVar8 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x33])(topNode);
        lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar8) + 0x28))
                           ((long *)CONCAT44(extraout_var_09,iVar8));
        iVar8 = **(int **)(*(long *)(lVar17 + 0xc0) + 8) + 1;
      }
    }
    paVar2 = &baseName.field_2;
    baseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    baseName._M_string_length = 0;
    baseName.field_2._M_local_buf[0] = '\0';
    baseName._M_dataplus._M_p = (pointer)paVar2;
    if (!bVar19) {
      pp_Var3 = (pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
      if (iVar6 == 0x10) {
        iVar6 = (*pp_Var3[0x1e])(pTVar11);
        pbVar13 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0x28))
                            ((long *)CONCAT44(extraout_var_10,iVar6));
      }
      else {
        iVar6 = (*pp_Var3[0x32])(pTVar11);
        pbVar13 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var_11,iVar6);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(&baseName,pbVar13);
    }
    iVar6 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
    p_Var15 = derefs.
              super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
              .
              super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    iVar9 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    blowUpActiveAggregate
              (this,(TType *)CONCAT44(extraout_var_12,iVar6),&baseName,&derefs,
               (const_iterator)p_Var15,local_98,iVar7,iVar8,-1,0,
               *(TStorageQualifier *)(CONCAT44(extraout_var_13,iVar9) + 8) & 0x7f,true);
  }
  return;
}

Assistant:

void addDereferencedUniform(TIntermBinary* topNode)
    {
        // See if too fine-grained to process (wait to get further down the tree)
        const TType& leftType = topNode->getLeft()->getType();
        if ((leftType.isVector() || leftType.isMatrix()) && ! leftType.isArray())
            return;

        // We have an array or structure or block dereference, see if it's a uniform
        // based dereference (if not, skip it).
        TIntermSymbol* base = findBase(topNode);
        if (! base || ! base->getQualifier().isUniformOrBuffer())
            return;

        // See if we've already processed this (e.g., in the middle of something
        // we did earlier), and if so skip it
        if (processedDerefs.find(topNode) != processedDerefs.end())
            return;

        // Process this uniform dereference

        int offset = -1;
        int blockIndex = -1;
        bool anonymous = false;

        // See if we need to record the block itself
        bool block = base->getBasicType() == EbtBlock;
        if (block) {
            offset = 0;
            anonymous = IsAnonymous(base->getName());

            const TString& blockName = base->getType().getTypeName();
            TString baseName;
            
            if (! anonymous)
                baseName = blockName;

            blockIndex = addBlockName(blockName, base->getType(), intermediate.getBlockSize(base->getType()));

            if (reflection.options & EShReflectionAllBlockVariables) {
                // Use a degenerate (empty) set of dereferences to immediately put as at the end of
                // the dereference change expected by blowUpActiveAggregate.
                TList<TIntermBinary*> derefs;

                // otherwise - if we're not using strict array suffix rules, or this isn't a block so we are
                // expanding root arrays anyway, just start the iteration from the base block type.
                blowUpActiveAggregate(base->getType(), baseName, derefs, derefs.end(), 0, blockIndex, 0, -1, 0,
                                          base->getQualifier().storage, false);
            }
        }

        // Process the dereference chain, backward, accumulating the pieces for later forward traversal.
        // If the topNode is a reflection-granularity-array dereference, don't include that last dereference.
        TList<TIntermBinary*> derefs;
        for (TIntermBinary* visitNode = topNode; visitNode; visitNode = visitNode->getLeft()->getAsBinaryNode()) {
            if (isReflectionGranularity(visitNode->getLeft()->getType()))
                continue;

            derefs.push_front(visitNode);
            processedDerefs.insert(visitNode);
        }
        processedDerefs.insert(base);

        // See if we have a specific array size to stick to while enumerating the explosion of the aggregate
        int arraySize = 0;
        if (isReflectionGranularity(topNode->getLeft()->getType()) && topNode->getLeft()->isArray()) {
            if (topNode->getOp() == EOpIndexDirect)
                arraySize = topNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst() + 1;
        }

        // Put the dereference chain together, forward
        TString baseName;
        if (! anonymous) {
            if (block)
                baseName = base->getType().getTypeName();
            else
                baseName = base->getName();
        }
        blowUpActiveAggregate(base->getType(), baseName, derefs, derefs.begin(), offset, blockIndex, arraySize, -1, 0,
                              base->getQualifier().storage, true);
    }